

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O3

void spvtools::anon_unknown_0::Nest
               (ControlFlowGraph *cfg,
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               *id_to_index,uint32_t id,uint32_t level)

{
  uint uVar1;
  pointer pSVar2;
  const_iterator cVar3;
  key_type_conflict local_14;
  
  if (id != 0) {
    cVar3 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&id_to_index->_M_h,&local_14);
    if (cVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
        == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    uVar1 = *(uint *)((long)cVar3.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                            ._M_cur + 0xc);
    pSVar2 = (cfg->blocks).
             super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar2[uVar1].nest_level_assigned == false) {
      pSVar2[uVar1].nest_level = level;
      pSVar2[uVar1].nest_level_assigned = true;
    }
  }
  return;
}

Assistant:

void Nest(ControlFlowGraph& cfg,
          const std::unordered_map<uint32_t, uint32_t>& id_to_index,
          uint32_t id, uint32_t level) {
  if (id == 0) {
    return;
  }

  const uint32_t block_index = id_to_index.at(id);
  SingleBlock& block = cfg.blocks[block_index];

  if (!block.nest_level_assigned) {
    block.nest_level = level;
    block.nest_level_assigned = true;
  }
}